

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall
clickhouse::Client::Impl::WriteBlock(Impl *this,Block *block,CodedOutputStream *output)

{
  bool bVar1;
  BlockInfo *pBVar2;
  size_t sVar3;
  string *psVar4;
  ColumnRef CVar5;
  Iterator bi;
  string local_70;
  Type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Iterator local_40;
  
  if (0xcabe < (this->server_info_).revision) {
    CodedOutputStream::WriteVarint64(output,1);
    pBVar2 = Block::Info(block);
    CodedOutputStream::WriteRaw(output,pBVar2,1);
    CodedOutputStream::WriteVarint64(output,2);
    pBVar2 = Block::Info(block);
    CodedOutputStream::WriteRaw(output,&pBVar2->bucket_num,4);
    CodedOutputStream::WriteVarint64(output,0);
  }
  sVar3 = Block::GetColumnCount(block);
  CodedOutputStream::WriteVarint64(output,sVar3);
  sVar3 = Block::GetRowCount(block);
  CodedOutputStream::WriteVarint64(output,sVar3);
  Block::Iterator::Iterator(&local_40,block);
  bVar1 = Block::Iterator::IsValid(&local_40);
  if (bVar1) {
    do {
      psVar4 = Block::Iterator::Name_abi_cxx11_(&local_40);
      CodedOutputStream::WriteVarint64(output,psVar4->_M_string_length);
      CodedOutputStream::WriteRaw(output,(psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length);
      Block::Iterator::Type(&local_40);
      Type::GetName_abi_cxx11_(&local_70,local_50);
      CodedOutputStream::WriteVarint64
                (output,CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length));
      CodedOutputStream::WriteRaw(output,local_70._M_dataplus._M_p,(int)local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      CVar5 = Block::Iterator::Column((Iterator *)&local_70);
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 0x20))
                (local_70._M_dataplus._M_p,output,
                 CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length));
      }
      Block::Iterator::Next(&local_40);
      bVar1 = Block::Iterator::IsValid(&local_40);
    } while (bVar1);
  }
  return;
}

Assistant:

void Client::Impl::WriteBlock(const Block& block, CodedOutputStream* output) {
    // Additional information about block.
    if (server_info_.revision >= DBMS_MIN_REVISION_WITH_BLOCK_INFO) {
        WireFormat::WriteUInt64(output, 1);
        WireFormat::WriteFixed (output, block.Info().is_overflows);
        WireFormat::WriteUInt64(output, 2);
        WireFormat::WriteFixed (output, block.Info().bucket_num);
        WireFormat::WriteUInt64(output, 0);
    }

    WireFormat::WriteUInt64(output, block.GetColumnCount());
    WireFormat::WriteUInt64(output, block.GetRowCount());

    for (Block::Iterator bi(block); bi.IsValid(); bi.Next()) {
        WireFormat::WriteString(output, bi.Name());
        WireFormat::WriteString(output, bi.Type()->GetName());

        bi.Column()->Save(output);
    }
}